

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O1

bool __thiscall
cmConfigureFileCommand::InitialPass
          (cmConfigureFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *in_path;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  string *psVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  pointer pbVar10;
  ulong uVar11;
  string unknown_args;
  string msg;
  string errorMessage;
  string local_1f0;
  string local_1d0;
  cmNewLineStyle *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  in_path = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)in_path) < 0x21) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments, expected 2","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,in_path,psVar4);
    psVar4 = &this->InputFile;
    std::__cxx11::string::operator=((string *)psVar4,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar4);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"input location\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(this->InputFile)._M_dataplus._M_p,
                          (this->InputFile)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"is a directory but a file was expected.",0x27);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,pbVar10 + 1,psVar6);
    psVar6 = &this->OutputFile;
    std::__cxx11::string::operator=((string *)psVar6,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar6);
    if (bVar2) {
      std::__cxx11::string::append((char *)psVar6);
      cmsys::SystemTools::GetFilenameName((string *)local_1a8,in_path);
      std::__cxx11::string::_M_append((char *)psVar6,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,psVar6);
    local_1a8._0_8_ = local_1a8 + 0x10;
    if (bVar2) {
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_1b0 = &this->NewLineStyle;
      bVar2 = cmNewLineStyle::ReadFromArguments(local_1b0,args,(string *)local_1a8);
      if (bVar2) {
        this->CopyOnly = false;
        this->EscapeQuotes = false;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        this->AtOnly = false;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0x40 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10)) {
          uVar1 = 3;
          uVar11 = 2;
          do {
            uVar9 = uVar1;
            iVar3 = std::__cxx11::string::compare((char *)(pbVar10 + uVar11));
            if (iVar3 == 0) {
              this->CopyOnly = true;
              bVar2 = cmNewLineStyle::IsValid(local_1b0);
              if (bVar2) {
                local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d0,
                           "COPYONLY could not be used in combination with NEWLINE_STYLE","");
                cmCommand::SetError(&this->super_cmCommand,&local_1d0);
                goto LAB_0023a73f;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar3 == 0) {
                this->EscapeQuotes = true;
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar11));
                if (iVar3 == 0) {
                  this->AtOnly = true;
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar11));
                  if ((((iVar3 != 0) &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0)) &&
                      (iVar3 = std::__cxx11::string::compare
                                         ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0)) &&
                     (((iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0 &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0)) &&
                      ((iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0 &&
                       (iVar3 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar11)), iVar3 != 0)))))) {
                    std::__cxx11::string::append((char *)&local_1f0);
                    std::__cxx11::string::_M_append
                              ((char *)&local_1f0,
                               (ulong)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus
                                      ._M_p);
                    std::__cxx11::string::append((char *)&local_1f0);
                  }
                }
              }
            }
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar1 = (ulong)((int)uVar9 + 1);
            uVar11 = uVar9;
          } while (uVar9 < (ulong)((long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10
                                  >> 5));
        }
        if (local_1f0._M_string_length != 0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"configure_file called with unknown argument(s):\n","");
          std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0._M_dataplus._M_p);
          cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        iVar3 = cmMakefile::ConfigureFile
                          ((this->super_cmCommand).Makefile,psVar4,psVar6,this->CopyOnly,
                           this->AtOnly,this->EscapeQuotes,
                           (cmNewLineStyle)(this->NewLineStyle).NewLineStyle);
        bVar2 = true;
        if (iVar3 == 0) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"Problem configuring file","");
          cmCommand::SetError(&this->super_cmCommand,&local_1d0);
LAB_0023a73f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
        bVar2 = false;
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return bVar2;
      }
      return bVar2;
    }
    std::operator+(&local_1f0,"attempted to configure a file: ",psVar6);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    puVar8 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar8) {
      local_1a8._16_8_ = *puVar8;
      local_1a8._24_8_ = plVar7[3];
    }
    else {
      local_1a8._16_8_ = *puVar8;
      local_1a8._0_8_ = (ulong *)*plVar7;
    }
    local_1a8._8_8_ = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    cmSystemTools::s_FatalErrorOccured = true;
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return false;
}

Assistant:

bool cmConfigureFileCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  this->InputFile = cmSystemTools::CollapseFullPath(
    inFile, this->Makefile->GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(this->InputFile)) {
    std::ostringstream e;
    /* clang-format off */
    e << "input location\n"
      << "  " << this->InputFile << "\n"
      << "is a directory but a file was expected.";
    /* clang-format on */
    this->SetError(e.str());
    return false;
  }

  std::string const& outFile = args[1];
  this->OutputFile = cmSystemTools::CollapseFullPath(
    outFile, this->Makefile->GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(this->OutputFile)) {
    this->OutputFile += "/";
    this->OutputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!this->Makefile->CanIWriteThisFile(this->OutputFile)) {
    std::string e = "attempted to configure a file: " + this->OutputFile +
      " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  std::string errorMessage;
  if (!this->NewLineStyle.ReadFromArguments(args, errorMessage)) {
    this->SetError(errorMessage);
    return false;
  }
  this->CopyOnly = false;
  this->EscapeQuotes = false;

  std::string unknown_args;
  this->AtOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      this->CopyOnly = true;
      if (this->NewLineStyle.IsValid()) {
        this->SetError("COPYONLY could not be used in combination "
                       "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      this->EscapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      this->AtOnly = true;
    } else if (args[i] == "IMMEDIATE") {
      /* Ignore legacy option.  */
    } else if (args[i] == "NEWLINE_STYLE" || args[i] == "LF" ||
               args[i] == "UNIX" || args[i] == "CRLF" || args[i] == "WIN32" ||
               args[i] == "DOS") {
      /* Options handled by NewLineStyle member above.  */
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = "configure_file called with unknown argument(s):\n";
    msg += unknown_args;
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (!this->ConfigureFile()) {
    this->SetError("Problem configuring file");
    return false;
  }

  return true;
}